

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaDAG.cpp
# Opt level: O2

WeightedDomainEnsemble * __thiscall
MatryoshkaDAG::extractTopK
          (WeightedDomainEnsemble *__return_storage_ptr__,MatryoshkaDAG *this,float areaCovered)

{
  double *pdVar1;
  long lVar2;
  ulong i;
  _Vector_base<Domain,_std::allocator<Domain>_> local_48;
  
  (__return_storage_ptr__->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->domainSets).
  super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->domainSets).
  super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->domainSets).
  super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar2 = 0;
  for (i = 0; i < this->params->K; i = i + 1) {
    extractDomains((DomainSet *)&local_48,this,i,areaCovered);
    std::
    vector<std::vector<Domain,std::allocator<Domain>>,std::allocator<std::vector<Domain,std::allocator<Domain>>>>
    ::emplace_back<std::vector<Domain,std::allocator<Domain>>>
              ((vector<std::vector<Domain,std::allocator<Domain>>,std::allocator<std::vector<Domain,std::allocator<Domain>>>>
                *)__return_storage_ptr__,(vector<Domain,_std::allocator<Domain>_> *)&local_48);
    std::_Vector_base<Domain,_std::allocator<Domain>_>::~_Vector_base(&local_48);
    pdVar1 = *(double **)
              &(this->OPT).
               super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[this->params->n].
               super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
               ._M_impl.super__Vector_impl_data;
    local_48._M_impl.super__Vector_impl_data._M_start =
         (pointer)(*(double *)((long)pdVar1 + lVar2) / *pdVar1);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&__return_storage_ptr__->weights,(double *)&local_48);
    lVar2 = lVar2 + 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

WeightedDomainEnsemble MatryoshkaDAG::extractTopK(float areaCovered) {
    WeightedDomainEnsemble ensemble;

    for (size_t i = 0; i < params->K; i++) { 
        ensemble.domainSets.push_back( extractDomains(i, areaCovered) );
        ensemble.weights.push_back( OPT[params->n][i].score/OPT[params->n][0].score );
    }

    return ensemble;
}